

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_multiple_positional_array_argument2(void)

{
  int iVar1;
  uint uVar2;
  ulong local_d8;
  size_t k_2;
  size_t k_1;
  char *args [9];
  ulong local_78;
  size_t m_count;
  float m_expect [3];
  float m [3];
  size_t j_count;
  int j_expect [3];
  int j [3];
  int i;
  size_t k;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&k,0,"program");
  if (iVar1 == 0) {
    stack0xffffffffffffffb4 = 0x315000001c8;
    j_expect[0] = 0x18af8;
    m[1] = 0.0;
    m[2] = 0.0;
    m_count = 0x401333334089999a;
    m_expect[0] = 50.34;
    local_78 = 0;
    memcpy(&k_1,&DAT_0013e540,0x48);
    uVar2 = cargo_add_option((cargo_t)k,0,"alpha","The alpha",".[i]#",j_expect + 1,m + 1,3);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    uVar2 = cargo_add_option((cargo_t)k,0,"mad","Mutual Assured Destruction",".[f]#",m_expect + 1,
                             &local_78,3);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    uVar2 = cargo_add_option((cargo_t)k,0,"--beta -b","The beta","i",j + 1);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse((cargo_t)k,0,1,9,(char **)&k_1);
      for (stack0xffffffffffffffd0 = 0; stack0xffffffffffffffd0 < (ulong)m._4_8_;
          stack0xffffffffffffffd0 = stack0xffffffffffffffd0 + 1) {
        printf("alpha = %d\n",(ulong)(uint)j_expect[stack0xffffffffffffffd0 + 1]);
      }
      for (stack0xffffffffffffffd0 = 0; stack0xffffffffffffffd0 < local_78;
          stack0xffffffffffffffd0 = stack0xffffffffffffffd0 + 1) {
        printf("mad = %f\n",(double)m_expect[stack0xffffffffffffffd0 + 1]);
      }
      if (cargo._4_4_ == 0) {
        printf("Check that \"j\" has 3 elements\n");
        if (m._4_8_ == 3) {
          for (k_2 = 0; k_2 < 3; k_2 = k_2 + 1) {
            if (j_expect[k_2 + 1] != *(int *)((long)&j_count + k_2 * 4 + 4)) {
              pcStack_18 = "Array contains unexpected value";
              goto LAB_0011e5bb;
            }
          }
          printf("Check that \"m\" has 3 elements\n");
          if (local_78 == 3) {
            for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
              if ((m_expect[local_d8 + 1] != m_expect[local_d8 - 2]) ||
                 (NAN(m_expect[local_d8 + 1]) || NAN(m_expect[local_d8 - 2]))) {
                pcStack_18 = "Array contains unexpected value";
                break;
              }
            }
          }
          else {
            pcStack_18 = "m array count m_count is not expected 3";
          }
        }
        else {
          pcStack_18 = "j array count j_count is not expected 3";
        }
      }
      else {
        pcStack_18 = "Failed to parse positional argument";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
LAB_0011e5bb:
    cargo_destroy((cargo_t *)&k);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_multiple_positional_array_argument2)
{
    // Shuffle the order of arguments
    size_t k;
    int i;
    int j[3];
    int j_expect[] = { 456, 789, 101112 };
    size_t j_count = 0;
    float m[3];
    float m_expect[] = { 4.3f, 2.3f, 50.34f };
    size_t m_count = 0;
    char *args[] =
    {
        "program",
        "456", "789", "101112",
        "--beta", "123",
        "4.3", "2.3", "50.34"
    };

    ret |= cargo_add_option(cargo, 0, "alpha", "The alpha", ".[i]#",
                            &j, &j_count, 3);
    ret |= cargo_add_option(cargo, 0, "mad", "Mutual Assured Destruction", ".[f]#",
                            &m, &m_count, 3);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &i);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);

    for (k = 0; k < j_count; k++)
    {
        printf("alpha = %d\n", j[k]);
    }

    for (k = 0; k < m_count; k++)
    {
        printf("mad = %f\n", m[k]);
    }

    cargo_assert(ret == 0, "Failed to parse positional argument");
    cargo_assert_array(j_count, 3, j, j_expect);
    cargo_assert(m, "m is NULL");
    cargo_assert_array(m_count, 3, m, m_expect);

    _TEST_CLEANUP();
}